

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

void __thiscall
slang::ast::CallExpression::serializeTo(CallExpression *this,ASTSerializer *serializer)

{
  __index_type _Var1;
  size_t sVar2;
  pointer ppEVar3;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar4;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar6;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar7;
  long lVar8;
  string_view *psVar9;
  string_view *psVar10;
  string_view name;
  string_view name_00;
  string_view name_01;
  
  if (*(__index_type *)
       ((long)&(this->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    pvVar4 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    ASTSerializer::write(serializer,10,"subroutine",(size_t)&((pvVar4->subroutine).ptr)->name);
    _Var1 = *(__index_type *)
             ((long)&(pvVar4->extraInfo).
                     super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             + 0x18);
    if (_Var1 == '\x02') {
      pvVar7 = std::
               get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar4->extraInfo);
      if (pvVar7->inlineConstraints != (Constraint *)0x0) {
        ASTSerializer::write(serializer,0x11,"inlineConstraints",(size_t)pvVar7->inlineConstraints);
      }
      if ((pvVar7->constraintRestrictions)._M_extent._M_extent_value != 0) {
        name_01._M_str = "constraintRestrictions";
        name_01._M_len = 0x16;
        ASTSerializer::startArray(serializer,name_01);
        sVar2 = (pvVar7->constraintRestrictions)._M_extent._M_extent_value;
        if (sVar2 != 0) {
          psVar10 = (pvVar7->constraintRestrictions)._M_ptr;
          psVar9 = psVar10 + sVar2;
          do {
            ASTSerializer::serialize(serializer,*psVar10);
            psVar10 = psVar10 + 1;
          } while (psVar10 != psVar9);
        }
        ASTSerializer::endArray(serializer);
      }
    }
    else if (_Var1 == '\x01') {
      pvVar5 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar4->extraInfo);
      if (pvVar5->iterVar != (ValueSymbol *)0x0) {
        ASTSerializer::write(serializer,7,"iterVar",(size_t)pvVar5->iterVar);
      }
      if (pvVar5->iterExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,8,"iterExpr",(size_t)pvVar5->iterExpr);
      }
    }
  }
  else {
    ppSVar6 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        (&this->subroutine);
    name._M_str = "subroutine";
    name._M_len = 10;
    ASTSerializer::writeLink(serializer,name,&(*ppSVar6)->super_Symbol);
  }
  if (this->thisClass_ != (Expression *)0x0) {
    ASTSerializer::write(serializer,9,"thisClass",(size_t)this->thisClass_);
  }
  if ((this->arguments_)._M_extent._M_extent_value != 0) {
    name_00._M_str = "arguments";
    name_00._M_len = 9;
    ASTSerializer::startArray(serializer,name_00);
    sVar2 = (this->arguments_)._M_extent._M_extent_value;
    if (sVar2 != 0) {
      ppEVar3 = (this->arguments_)._M_ptr;
      lVar8 = 0;
      do {
        ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar3 + lVar8));
        lVar8 = lVar8 + 8;
      } while (sVar2 << 3 != lVar8);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void CallExpression::serializeTo(ASTSerializer& serializer) const {
    if (subroutine.index() == 1) {
        auto& callInfo = std::get<1>(subroutine);
        serializer.write("subroutine", callInfo.subroutine->name);

        if (callInfo.extraInfo.index() == 1) {
            auto& itInfo = std::get<1>(callInfo.extraInfo);
            if (itInfo.iterVar)
                serializer.write("iterVar", *itInfo.iterVar);
            if (itInfo.iterExpr)
                serializer.write("iterExpr", *itInfo.iterExpr);
        }
        else if (callInfo.extraInfo.index() == 2) {
            auto& randInfo = std::get<2>(callInfo.extraInfo);
            if (randInfo.inlineConstraints)
                serializer.write("inlineConstraints", *randInfo.inlineConstraints);

            if (!randInfo.constraintRestrictions.empty()) {
                serializer.startArray("constraintRestrictions");
                for (auto name : randInfo.constraintRestrictions)
                    serializer.serialize(name);
                serializer.endArray();
            }
        }
    }
    else {
        const SubroutineSymbol& symbol = *std::get<0>(subroutine);
        serializer.writeLink("subroutine", symbol);
    }

    if (thisClass())
        serializer.write("thisClass", *thisClass());

    if (!arguments().empty()) {
        serializer.startArray("arguments");
        for (auto arg : arguments())
            serializer.serialize(*arg);
        serializer.endArray();
    }
}